

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

void bc7enc_compress_block_init(void)

{
  int c;
  long lVar1;
  uint32_t h_1;
  ulong uVar2;
  ulong in_RDX;
  uint32_t l;
  int iVar3;
  ulong uVar4;
  ulong in_RSI;
  uint32_t hp;
  int iVar5;
  uint32_t lp;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint32_t h;
  ulong uVar14;
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    iVar5 = 0;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      uVar9 = 0xffff;
      uVar4 = 0;
      while (iVar3 = (int)uVar4, iVar3 != 0x40) {
        iVar10 = iVar5;
        for (uVar14 = 0; (int)uVar14 != 0x40; uVar14 = (ulong)((int)uVar14 + 1)) {
          iVar12 = ((uint)(((int)(uVar14 >> 5) + iVar10) * 0x12 +
                          ((int)(uVar4 >> 5) + iVar3 * 4 | (int)lVar6 * 2) * 0x2e + 0x20) >> 6) -
                   (int)lVar1;
          uVar13 = iVar12 * iVar12;
          uVar8 = uVar9 & 0xffff;
          uVar9 = uVar8;
          if (uVar13 < uVar8) {
            in_RDX = uVar4;
            uVar9 = uVar13;
          }
          in_RDX = in_RDX & 0xff;
          in_RSI = in_RSI & 0xff;
          if (uVar13 < uVar8) {
            in_RSI = uVar14;
          }
          iVar10 = iVar10 + 4;
        }
        uVar4 = (ulong)(iVar3 + 1);
      }
      g_bc7_mode_1_optimal_endpoints[lVar1][lVar6].m_error = (uint16_t)uVar9;
      *(char *)(lVar1 * 8 + 0x1661a2 + lVar6 * 4) = (char)in_RDX;
      *(char *)(lVar1 * 8 + 0x1661a3 + lVar6 * 4) = (char)in_RSI;
      iVar5 = iVar5 + 2;
    }
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    iVar5 = 0;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        uVar9 = 0;
        uVar8 = 0xffff;
        uVar4 = 0;
        uVar14 = 0;
        while (iVar3 = (int)uVar14, iVar3 != 0x20) {
          uVar2 = 0;
          iVar10 = iVar5;
          while (uVar13 = (uint)uVar2, uVar13 != 0x20) {
            iVar12 = (((int)(uVar2 >> 3) + iVar10) * 0x15 +
                      ((uint)(uVar14 >> 3) | (int)lVar7 * 4 + iVar3 * 8) * 0x2b + 0x20 >> 6) -
                     (int)lVar1;
            uVar11 = iVar12 * iVar12;
            uVar8 = uVar8 & 0xffff;
            uVar9 = uVar9 & 0xff;
            if (uVar11 < uVar8) {
              uVar4 = uVar14;
              uVar9 = uVar13;
            }
            uVar4 = uVar4 & 0xff;
            if (uVar11 < uVar8) {
              uVar8 = uVar11;
            }
            iVar10 = iVar10 + 8;
            uVar2 = (ulong)(uVar13 + 1);
          }
          uVar14 = (ulong)(iVar3 + 1);
        }
        g_bc7_mode_7_optimal_endpoints[lVar1][lVar6][lVar7].m_error = (uint16_t)uVar8;
        g_bc7_mode_7_optimal_endpoints[lVar1][lVar6][lVar7].m_lo = (uint8_t)uVar4;
        g_bc7_mode_7_optimal_endpoints[lVar1][lVar6][lVar7].m_hi = (uint8_t)uVar9;
      }
      iVar5 = iVar5 + 4;
    }
  }
  return;
}

Assistant:

void bc7enc_compress_block_init()
{
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t lp = 0; lp < 2; lp++)
		{
			endpoint_err best;
			best.m_error = (uint16_t)UINT16_MAX;
			for (uint32_t l = 0; l < 64; l++)
			{
				uint32_t low = ((l << 1) | lp) << 1;
				low |= (low >> 7);
				for (uint32_t h = 0; h < 64; h++)
				{
					uint32_t high = ((h << 1) | lp) << 1;
					high |= (high >> 7);
					const int k = (low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6;
					const int err = (k - c) * (k - c);
					if (err < best.m_error)
					{
						best.m_error = (uint16_t)err;
						best.m_lo = (uint8_t)l;
						best.m_hi = (uint8_t)h;
					}
				} // h
			} // l
			g_bc7_mode_1_optimal_endpoints[c][lp] = best;
		} // lp
	} // c

	// Mode 7: 555.1 2-bit indices 
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t hp = 0; hp < 2; hp++)
		{
			for (uint32_t lp = 0; lp < 2; lp++)
			{
				endpoint_err best;
				best.m_error = (uint16_t)UINT16_MAX;
				best.m_lo = 0;
				best.m_hi = 0;

				for (uint32_t l = 0; l < 32; l++)
				{
					uint32_t low = ((l << 1) | lp) << 2;
					low |= (low >> 6);

					for (uint32_t h = 0; h < 32; h++)
					{
						uint32_t high = ((h << 1) | hp) << 2;
						high |= (high >> 6);

						const int k = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;

						const int err = (k - c) * (k - c);
						if (err < best.m_error)
						{
							best.m_error = (uint16_t)err;
							best.m_lo = (uint8_t)l;
							best.m_hi = (uint8_t)h;
						}
					} // h
				} // l

				g_bc7_mode_7_optimal_endpoints[c][hp][lp] = best;

			} // hp

		} // lp

	} // c
}